

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O1

void f2(int (*a) [22])

{
  spin_mutex_t sVar1;
  uint uVar2;
  ostream *poVar3;
  long lVar4;
  
  if ((second_round) && ((int)x.super___atomic_base<int>._M_i < 0)) {
    uVar2 = 1;
  }
  else {
    uVar2 = 0;
    if (!second_round) {
      uVar2 = ~(uint)x.super___atomic_base<int>._M_i >> 0x1f;
    }
  }
  LOCK();
  success_counter.super___atomic_base<int>._M_i =
       (__atomic_base<int>)((int)success_counter.super___atomic_base<int>._M_i + uVar2);
  UNLOCK();
  do {
    sVar1.lock_.super___atomic_flag_base._M_i = my_io_mutex.lock_.super___atomic_flag_base._M_i;
    LOCK();
    my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x1;
    UNLOCK();
  } while ((__atomic_flag_base)sVar1.lock_.super___atomic_flag_base._M_i != false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"f2 ",3);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(*a)[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," begin: ",8);
  lVar4 = std::chrono::_V2::system_clock::now();
  poVar3 = std::ostream::_M_insert<double>((double)(lVar4 - (long)t0.__d.__r) / 1000000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  fun(true,600);
  do {
    sVar1.lock_.super___atomic_flag_base._M_i = my_io_mutex.lock_.super___atomic_flag_base._M_i;
    LOCK();
    my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x1;
    UNLOCK();
  } while ((__atomic_flag_base)sVar1.lock_.super___atomic_flag_base._M_i != false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"f2 ",3);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(*a)[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," end: ",6);
  lVar4 = std::chrono::_V2::system_clock::now();
  poVar3 = std::ostream::_M_insert<double>((double)(lVar4 - (long)t0.__d.__r) / 1000000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  LOCK();
  x.super___atomic_base<int>._M_i = (__atomic_base<int>)((int)x.super___atomic_base<int>._M_i + 8);
  UNLOCK();
  if ((second_round == true) && ((int)x.super___atomic_base<int>._M_i < 0)) {
    uVar2 = 1;
  }
  else {
    uVar2 = 0;
    if (second_round == false) {
      uVar2 = ~(uint)x.super___atomic_base<int>._M_i >> 0x1f;
    }
  }
  LOCK();
  success_counter.super___atomic_base<int>._M_i =
       (__atomic_base<int>)((int)success_counter.super___atomic_base<int>._M_i + uVar2);
  UNLOCK();
  return;
}

Assistant:

void f2(const int (&a)[22])
{ 
  success_counter.fetch_add((second_round && (x<0)) || (!second_round && (x>=0)));
  
  LOG("f2 " << a[0] << " begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count()); 
  //a[0]++;
  fun(true);
  LOG("f2 " << a[0] << " end: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count());
  x.fetch_add(8);
  success_counter.fetch_add((second_round && (x<0)) || (!second_round && (x>=0)));
}